

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textdefs.c
# Opt level: O0

void str_hex(_WString *s,uint8_t *buf,uint len)

{
  uint i;
  uint len_local;
  uint8_t *buf_local;
  _WString *s_local;
  
  i = 0;
  s->length = len << 1;
  s->p[len << 1] = '\0';
  buf_local = buf;
  do {
    *(undefined2 *)(s->p + i) = *(undefined2 *)(str_hex::TextBTable + (int)((uint)*buf_local << 1));
    buf_local = buf_local + 1;
    i = i + 2;
  } while (i < len << 1);
  return;
}

Assistant:

void str_hex(_WString* s, const uint8_t* buf, unsigned int len)
{
	/* 256 * 2 : 2 chars per byte value. */
	static const char* TextBTable =
		"000102030405060708090a0b0c0d0e0f" \
		"101112131415161718191a1b1c1d1e1f" \
		"202122232425262728292a2b2c2d2e2f" \
		"303132333435363738393a3b3c3d3e3f" \
		"404142434445464748494a4b4c4d4e4f" \
		"505152535455565758595a5b5c5d5e5f" \
		"606162636465666768696a6b6c6d6e6f" \
		"707172737475767778797a7b7c7d7e7f" \
		"808182838485868788898a8b8c8d8e8f" \
		"909192939495969798999a9b9c9d9e9f" \
		"a0a1a2a3a4a5a6a7a8a9aaabacadaeaf" \
		"b0b1b2b3b4b5b6b7b8b9babbbcbdbebf" \
		"c0c1c2c3c4c5c6c7c8c9cacbcccdcecf" \
		"d0d1d2d3d4d5d6d7d8d9dadbdcdddedf" \
		"e0e1e2e3e4e5e6e7e8e9eaebecedeeef" \
		"f0f1f2f3f4f5f6f7f8f9fafbfcfdfeff";
	
	unsigned int i = 0;
	/* Length is at least 1, enter loop. */
	s->length = len * 2;
	s->p[len * 2] = 0;
	do {
		RSHORT(&s->p[i]) = RSHORT(&TextBTable[(*buf) * 2]);
		buf++;
		i += 2;
	} while (i < len * 2);
}